

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread.c
# Opt level: O0

void hd_consumer_create(hd_context *ctx,hd_disk *disk,hd_part *part)

{
  int iVar1;
  uint *puVar2;
  int index;
  hd_part *part_local;
  hd_disk *disk_local;
  hd_context *ctx_local;
  
  (ctx->pthread->consumer).ctx = ctx;
  (ctx->pthread->consumer).part = part;
  (ctx->pthread->consumer).disk = disk;
  (ctx->pthread->consumer).index = 0;
  iVar1 = pthread_create(&(ctx->pthread->consumer).threadid,
                         (pthread_attr_t *)&ctx->pthread->thread_attr,consumer_thread,
                         &ctx->pthread->consumer);
  if (iVar1 < 0) {
    puVar2 = (uint *)__errno_location();
    hd_throw(ctx,2,"pthread_create consumer failed\t: %d\n",(ulong)*puVar2);
  }
  ctx->pthread->consumer_thread_num = 1;
  return;
}

Assistant:

void
hd_consumer_create(hd_context *ctx, hd_disk *disk, hd_part *part)
{

    /*FIXME:ctx->pthread->consumer should be an array*/
    int index = 1;
    ctx->pthread->consumer.ctx = ctx;
    ctx->pthread->consumer.part = part;
    ctx->pthread->consumer.disk = disk;
    ctx->pthread->consumer.index = 0;
    if (pthread_create(&ctx->pthread->consumer.threadid, &ctx->pthread->thread_attr,
                       consumer_thread, &ctx->pthread->consumer) < 0)
        hd_throw(ctx,HD_ERROR_GENERIC, "pthread_create consumer failed	: %d\n", errno);

    ctx->pthread->consumer_thread_num = index;
}